

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O2

void spdlog::details::fmt_helper::pad_uint<unsigned_long>
               (unsigned_long n,uint width,memory_buf_t *dest)

{
  uint uVar1;
  
  uVar1 = fmt::v6::internal::count_digits(n);
  if (uVar1 < width) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,"0000000000000000000",
               "0000000000000000000" + ((ulong)width - (ulong)uVar1));
  }
  append_int<unsigned_long>(n,dest);
  return;
}

Assistant:

inline void pad_uint(T n, unsigned int width, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad_uint must get unsigned T");
    auto digits = count_digits(n);
    if (width > digits)
    {
        const char *zeroes = "0000000000000000000";
        dest.append(zeroes, zeroes + width - digits);
    }
    append_int(n, dest);
}